

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O3

void __thiscall PointAccessors::test_method(PointAccessors *this)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  VectorXd v;
  CartesianProduct S;
  Point x;
  RealSpace R2;
  RealSpace R3;
  Scalar local_560 [2];
  shared_count sStack_550;
  Matrix<double,__1,_1,_0,__1,_1> local_548;
  char *local_538;
  char *local_530;
  char *local_520;
  char *local_518;
  RealScalar local_510;
  Matrix<double,_2,_1,_0,_2,_1> local_508;
  Matrix<double,_3,_1,_0,_3,_1> local_4f8;
  undefined **local_4d8;
  undefined1 local_4d0;
  undefined8 *local_4c8;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *local_4c0;
  double *local_4b8;
  long local_4b0;
  void *local_4a0;
  undefined8 uStack_498;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  code *local_2e8 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_290 [24];
  void *local_278;
  void *local_260;
  undefined1 local_248 [24];
  long local_230 [34];
  code *local_120 [11];
  void *local_c8;
  void *local_b8;
  code *local_a8 [11];
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_a8,3);
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_4f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  mnf::RealSpace::RealSpace((RealSpace *)local_120,2);
  local_508.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       10.0;
  local_508.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       20.0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       Eigen::internal::conditional_aligned_new_auto<double,true>(5);
  local_248._0_8_ = &local_548;
  local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 5;
  local_248._8_8_ = (void *)0x0;
  local_248._16_8_ = 1;
  local_230[0] = 1;
  *local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 1.0;
  local_4b8 = (double *)0x4000000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_248,
                      (Scalar *)&local_4b8);
  local_2e8[0] = (code *)0x4008000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,(Scalar *)local_2e8);
  local_4d8 = (undefined **)0x4024000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar2,(Scalar *)&local_4d8);
  local_560[0] = 20.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,local_560);
  if ((local_230[0] + local_248._8_8_ ==
       (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_248._0_8_)->m_storage).
       m_rows) && (local_248._16_8_ == 1)) {
    mnf::CartesianProduct::CartesianProduct
              ((CartesianProduct *)local_2e8,(Manifold *)local_a8,(Manifold *)local_120);
    local_4a0 = (void *)0x0;
    uStack_498 = 0;
    local_4b8 = local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
    local_4b0 = local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
    if (-1 < local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows ||
        local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (double *)0x0) {
      mnf::Manifold::createPoint((Ref *)local_248);
      free(local_4a0);
      local_2f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_2f0 = "";
      local_308 = &boost::unit_test::basic_cstring<char_const>::null;
      local_300 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x4e);
      mnf::SubPoint::operator()((SubPoint *)&local_4b8,(ulong)local_230);
      mnf::SubPoint::value();
      local_510 = 1e-12;
      bVar1 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
              ::run(&local_4f8,
                    (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                    &local_538,&local_510);
      local_560[1] = 0.0;
      sStack_550.pi_ = (sp_counted_base *)0x0;
      local_520 = "v3.isApprox(x(0).value())";
      local_518 = "";
      local_4d0 = 0;
      local_4d8 = &PTR__lazy_ostream_00128c30;
      local_4c8 = &boost::unit_test::lazy_ostream::inst;
      local_318 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_310 = "";
      local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                  &local_520;
      local_560[0]._0_1_ = bVar1;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_550);
      mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_4b8);
      local_328 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_320 = "";
      local_338 = &boost::unit_test::basic_cstring<char_const>::null;
      local_330 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x4f);
      mnf::SubPoint::operator()((SubPoint *)&local_4b8,(ulong)local_230);
      mnf::SubPoint::value();
      local_510 = 1e-12;
      local_560[0]._0_1_ =
           Eigen::internal::
           isApprox_selector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
           ::run(&local_508,
                 (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                 &local_538,&local_510);
      local_560[1] = 0.0;
      sStack_550.pi_ = (sp_counted_base *)0x0;
      local_520 = "v2.isApprox(x(1).value())";
      local_518 = "";
      local_4d0 = 0;
      local_4d8 = &PTR__lazy_ostream_00128c30;
      local_4c8 = &boost::unit_test::lazy_ostream::inst;
      local_348 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_340 = "";
      local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                  &local_520;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_550);
      mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_4b8);
      local_358 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_350 = "";
      local_368 = &boost::unit_test::basic_cstring<char_const>::null;
      local_360 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,0x50);
      mnf::SubPoint::operator[]((ulong)&local_4b8);
      local_520 = (char *)0x3d719799812dea11;
      local_560[0]._0_1_ =
           Eigen::internal::
           isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
           ::run(&local_4f8,
                 (Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                  *)&local_4b8,(RealScalar *)&local_520);
      local_560[1] = 0.0;
      sStack_550.pi_ = (sp_counted_base *)0x0;
      local_538 = "v3.isApprox(x[0])";
      local_530 = "";
      local_4d0 = 0;
      local_4d8 = &PTR__lazy_ostream_00128c30;
      local_4c8 = &boost::unit_test::lazy_ostream::inst;
      local_378 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_370 = "";
      local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                  &local_538;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_550);
      local_388 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_380 = "";
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      local_390 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x51);
      mnf::SubPoint::operator[]((ulong)&local_4b8);
      local_520 = (char *)0x3d719799812dea11;
      bVar1 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1,_1,_false>,_false>
              ::run(&local_508,
                    (Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                     *)&local_4b8,(RealScalar *)&local_520);
      local_560[0] = (Scalar)CONCAT71(local_560[0]._1_7_,bVar1);
      local_560[1] = 0.0;
      sStack_550.pi_ = (sp_counted_base *)0x0;
      local_538 = "v2.isApprox(x[1])";
      local_530 = "";
      local_4d0 = 0;
      local_4d8 = &PTR__lazy_ostream_00128c30;
      local_4c8 = &boost::unit_test::lazy_ostream::inst;
      local_3a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
      ;
      local_3a0 = "";
      local_4c0 = (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                  &local_538;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_550);
      mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)local_230);
      free((void *)local_248._8_8_);
      local_2e8[0] = mnf::Point::getRepresentationDimM;
      if (local_260 != (void *)0x0) {
        operator_delete(local_260);
      }
      if (local_278 != (void *)0x0) {
        operator_delete(local_278);
      }
      std::
      vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
      ::~vector(local_290);
      mnf::Manifold::~Manifold((Manifold *)local_2e8);
      free(local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      local_120[0] = mnf::operator+;
      free(local_b8);
      free(local_c8);
      mnf::Manifold::~Manifold((Manifold *)local_120);
      local_a8[0] = mnf::operator+;
      free(local_40);
      free(local_50);
      mnf::Manifold::~Manifold((Manifold *)local_a8);
      return;
    }
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(PointAccessors)
{
  RealSpace R3(3);
  Eigen::Vector3d v3(1, 2, 3);
  RealSpace R2(2);
  Eigen::Vector2d v2(10, 20);
  Eigen::VectorXd v(5);
  v << 1, 2, 3, 10, 20;
  CartesianProduct S(R3, R2);
  Point x = S.createPoint(v);
  BOOST_CHECK(v3.isApprox(x(0).value()));
  BOOST_CHECK(v2.isApprox(x(1).value()));
  BOOST_CHECK(v3.isApprox(x[0]));
  BOOST_CHECK(v2.isApprox(x[1]));
}